

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-path.c
# Opt level: O1

void plutovg_path_add_path(plutovg_path_t *path,plutovg_path_t *source,plutovg_matrix_t *matrix)

{
  int *piVar1;
  plutovg_path_command_t pVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  plutovg_path_element_t *ppVar6;
  long lVar7;
  plutovg_path_element_t *ppVar8;
  int iVar9;
  plutovg_point_t points [3];
  plutovg_point_t local_58;
  plutovg_point_t local_50;
  plutovg_point_t local_48;
  plutovg_matrix_t *local_40;
  float local_38;
  float local_34;
  
  ppVar8 = (source->elements).data;
  local_40 = matrix;
  if (matrix == (plutovg_matrix_t *)0x0) {
    if ((ppVar8 != (plutovg_path_element_t *)0x0) && (iVar5 = (source->elements).size, 0 < iVar5)) {
      iVar5 = iVar5 + (path->elements).size;
      iVar9 = (path->elements).capacity;
      if (iVar9 < iVar5) {
        iVar4 = 8;
        if (iVar9 != 0) {
          iVar4 = iVar9;
        }
        do {
          iVar9 = iVar4;
          iVar4 = iVar9 * 2;
        } while (iVar9 < iVar5);
        ppVar8 = (plutovg_path_element_t *)realloc((path->elements).data,(long)iVar9 << 3);
        (path->elements).data = ppVar8;
        (path->elements).capacity = iVar9;
      }
      memcpy((path->elements).data + (path->elements).size,(source->elements).data,
             (long)(source->elements).size << 3);
      piVar1 = &(path->elements).size;
      *piVar1 = *piVar1 + (source->elements).size;
    }
    path->start_point = source->start_point;
    path->num_points = path->num_points + source->num_points;
    path->num_contours = path->num_contours + source->num_contours;
    path->num_curves = path->num_curves + source->num_curves;
  }
  else {
    iVar5 = (source->elements).size;
    iVar4 = (path->elements).size + iVar5;
    iVar9 = (path->elements).capacity;
    if (iVar9 < iVar4) {
      iVar3 = 8;
      if (iVar9 != 0) {
        iVar3 = iVar9;
      }
      do {
        iVar9 = iVar3;
        iVar3 = iVar9 * 2;
      } while (iVar9 < iVar4);
      ppVar6 = (plutovg_path_element_t *)realloc((path->elements).data,(long)iVar9 << 3);
      (path->elements).data = ppVar6;
      (path->elements).capacity = iVar9;
    }
    if (0 < iVar5) {
      iVar9 = 0;
      do {
        lVar7 = (long)iVar9;
        pVar2 = ppVar8[lVar7].header.command;
        if (pVar2 < PLUTOVG_PATH_COMMAND_CUBIC_TO) {
LAB_0012b44d:
          local_58 = ppVar8[lVar7 + 1].point;
        }
        else if (pVar2 == PLUTOVG_PATH_COMMAND_CUBIC_TO) {
          local_58 = ppVar8[lVar7 + 1].point;
          local_50 = ppVar8[lVar7 + 2].point;
          local_48 = ppVar8[lVar7 + 3].point;
        }
        else if (pVar2 == PLUTOVG_PATH_COMMAND_CLOSE) goto LAB_0012b44d;
        iVar9 = *(int *)((long)ppVar8 + lVar7 * 8 + 4) + iVar9;
        switch(ppVar8[lVar7].header.command) {
        case PLUTOVG_PATH_COMMAND_MOVE_TO:
          plutovg_matrix_map_points(local_40,&local_58,&local_58,1);
          local_34 = local_58.x;
          local_38 = local_58.y;
          ppVar6 = plutovg_path_add_command(path,PLUTOVG_PATH_COMMAND_MOVE_TO,1);
          (ppVar6->header).command = (plutovg_path_command_t)local_34;
          (ppVar6->header).length = (int)local_38;
          (path->start_point).x = local_34;
          (path->start_point).y = local_38;
          path->num_contours = path->num_contours + 1;
          break;
        case PLUTOVG_PATH_COMMAND_LINE_TO:
          plutovg_matrix_map_points(local_40,&local_58,&local_58,1);
          plutovg_path_line_to(path,local_58.x,local_58.y);
          break;
        case PLUTOVG_PATH_COMMAND_CUBIC_TO:
          plutovg_matrix_map_points(local_40,&local_58,&local_58,3);
          plutovg_path_cubic_to
                    (path,local_58.x,local_58.y,local_50.x,local_50.y,local_48.x,local_48.y);
          break;
        case PLUTOVG_PATH_COMMAND_CLOSE:
          if ((path->elements).size != 0) {
            ppVar6 = plutovg_path_add_command(path,PLUTOVG_PATH_COMMAND_CLOSE,1);
            *ppVar6 = *(plutovg_path_element_t *)&path->start_point;
          }
        }
      } while (iVar9 < iVar5);
    }
  }
  return;
}

Assistant:

void plutovg_path_add_path(plutovg_path_t* path, const plutovg_path_t* source, const plutovg_matrix_t* matrix)
{
    if(matrix == NULL) {
        plutovg_array_append(path->elements, source->elements);
        path->start_point = source->start_point;
        path->num_points += source->num_points;
        path->num_contours += source->num_contours;
        path->num_curves += source->num_curves;
        return;
    }

    plutovg_path_iterator_t it;
    plutovg_path_iterator_init(&it, source);

    plutovg_point_t points[3];
    plutovg_array_ensure(path->elements, source->elements.size);
    while(plutovg_path_iterator_has_next(&it)) {
        switch(plutovg_path_iterator_next(&it, points)) {
        case PLUTOVG_PATH_COMMAND_MOVE_TO:
            plutovg_matrix_map_points(matrix, points, points, 1);
            plutovg_path_move_to(path, points[0].x, points[0].y);
            break;
        case PLUTOVG_PATH_COMMAND_LINE_TO:
            plutovg_matrix_map_points(matrix, points, points, 1);
            plutovg_path_line_to(path, points[0].x, points[0].y);
            break;
        case PLUTOVG_PATH_COMMAND_CUBIC_TO:
            plutovg_matrix_map_points(matrix, points, points, 3);
            plutovg_path_cubic_to(path, points[0].x, points[0].y, points[1].x, points[1].y, points[2].x, points[2].y);
            break;
        case PLUTOVG_PATH_COMMAND_CLOSE:
            plutovg_path_close(path);
            break;
        }
    }
}